

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O0

void __thiscall
vera::Label::Label(Label *this,string *_text,Node *_node,LabelType _type,float _margin)

{
  float _margin_local;
  LabelType _type_local;
  Node *_node_local;
  string *_text_local;
  Label *this_local;
  
  BoundingBox::BoundingBox(&this->super_BoundingBox);
  this->_vptr_Label = (_func_int **)&PTR_getScreenPosition_0076cdb8;
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&this->m_textFunc);
  std::__cxx11::string::string((string *)&this->m_text);
  BoundingBox::BoundingBox(&this->m_screenBox);
  this->m_bbox = (BoundingBox *)0x0;
  setText(this,_text);
  linkTo(this,_node);
  setType(this,_type);
  setMargin(this,_margin);
  return;
}

Assistant:

Label::Label(const std::string& _text, Node* _node, LabelType _type, float _margin) : m_bbox(nullptr) { 
    setText(_text);
    linkTo(_node);
    setType(_type);
    setMargin(_margin);
}